

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

void __thiscall tcmalloc::PageHeap::RemoveFromFreeList(PageHeap *this,Span *span)

{
  uint64_t *puVar1;
  _Rb_tree<tcmalloc::SpanPtrWithLength,tcmalloc::SpanPtrWithLength,std::_Identity<tcmalloc::SpanPtrWithLength>,tcmalloc::SpanBestFitLess,tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,void>>
  *this_00;
  
  puVar1 = &(this->stats_).free_bytes + ((*(uint *)&span->field_0x28 & 0x3000000) != 0x1000000);
  *puVar1 = *puVar1 + span->length * -0x2000;
  if (0x80 < span->length) {
    this_00 = (_Rb_tree<tcmalloc::SpanPtrWithLength,tcmalloc::SpanPtrWithLength,std::_Identity<tcmalloc::SpanPtrWithLength>,tcmalloc::SpanBestFitLess,tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,void>>
               *)&this->large_returned_;
    if ((*(uint *)&span->field_0x28 & 0x3000000) != 0x2000000) {
      this_00 = (_Rb_tree<tcmalloc::SpanPtrWithLength,tcmalloc::SpanPtrWithLength,std::_Identity<tcmalloc::SpanPtrWithLength>,tcmalloc::SpanBestFitLess,tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,void>>
                 *)&this->large_normal_;
    }
    *(uint *)&span->field_0x28 = *(uint *)&span->field_0x28 & 0xf7ffffff;
    std::
    _Rb_tree<tcmalloc::SpanPtrWithLength,tcmalloc::SpanPtrWithLength,std::_Identity<tcmalloc::SpanPtrWithLength>,tcmalloc::SpanBestFitLess,tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,void>>
    ::erase_abi_cxx11_(this_00,(const_iterator)span->field_4);
    return;
  }
  DLL_Remove(span);
  return;
}

Assistant:

void PageHeap::RemoveFromFreeList(Span* span) {
  ASSERT(lock_.IsHeld());
  ASSERT(span->location != Span::IN_USE);
  if (span->location == Span::ON_NORMAL_FREELIST) {
    stats_.free_bytes -= (span->length << kPageShift);
  } else {
    stats_.unmapped_bytes -= (span->length << kPageShift);
  }
  if (span->length > kMaxPages) {
    SpanSet *set = &large_normal_;
    if (span->location == Span::ON_RETURNED_FREELIST)
      set = &large_returned_;
    SpanSetIter iter = span->ExtractSpanSetIterator();
    ASSERT(iter->span == span);
    ASSERT(set->find(SpanPtrWithLength(span)) == iter);
    set->erase(iter);
  } else {
    DLL_Remove(span);
  }
}